

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rewriting.cpp
# Opt level: O1

void apply_mapping(NS *base,
                  map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                  *base_to_template)

{
  mapped_type pNVar1;
  undefined8 *puVar2;
  key_type *__k;
  N *pNVar3;
  long *plVar4;
  long *plVar5;
  mapped_type *ppNVar6;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  runtime_error *this;
  map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> *__range1;
  nodeit *pnVar9;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var10;
  pointer ppNVar11;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *pCVar12;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> _Var13;
  initializer_list<N_*> ns;
  N *p;
  N *o;
  vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> nested_connections;
  vector<std::pair<N_*,_N_*>,_std::allocator<std::pair<N_*,_N_*>_>_> template_connections;
  set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
  added;
  set<std::pair<N_*,_N_*>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
  deleted;
  map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> nested_to_template;
  map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_> template_to_base;
  undefined1 local_188 [16];
  N *local_178;
  N *local_170;
  nodeit local_168;
  void *local_148;
  undefined8 uStack_140;
  long local_138;
  void *local_128;
  undefined8 uStack_120;
  long local_118;
  N *local_110;
  N *local_108;
  _Rb_tree<std::pair<N_*,_N_*>,_std::pair<N_*,_N_*>,_std::_Identity<std::pair<N_*,_N_*>_>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
  local_100;
  _Rb_tree<std::pair<N_*,_N_*>,_std::pair<N_*,_N_*>,_std::_Identity<std::pair<N_*,_N_*>_>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
  _Stack_d0;
  _Rb_tree_node_base *p_Stack_a0;
  pointer local_98;
  _Rb_tree<N_*,_std::pair<N_*const,_N_*>,_std::_Select1st<std::pair<N_*const,_N_*>_>,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
  local_90;
  _Rb_tree<N_*,_std::pair<N_*const,_N_*>,_std::_Select1st<std::pair<N_*const,_N_*>_>,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var7 = (base_to_template->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_188._8_8_ = &(base_to_template->_M_t)._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var7 != (_Base_ptr)local_188._8_8_) {
    do {
      pNVar1 = *(mapped_type *)(p_Var7 + 1);
      ppNVar6 = std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::
                operator[]((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                            *)&local_60,(key_type *)&p_Var7[1]._M_parent);
      *ppNVar6 = pNVar1;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != (_Base_ptr)local_188._8_8_);
  }
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var8 = (base_to_template->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var8 != (_Rb_tree_node_base *)local_188._8_8_) {
    do {
      pNVar1 = *(mapped_type *)(p_Var8 + 1);
      if ((*(__index_type *)
            ((long)&(pNVar1->data).
                    super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
                    .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                    super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                    super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                    super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                    super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>
            + 0x20) == '\x03') &&
         (puVar2 = *(undefined8 **)
                    &(pNVar1->data).
                     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
                     .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>
                     ._M_u, __k = (key_type *)*puVar2, puVar2[1] - (long)__k == 8)) {
        ppNVar6 = std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>::
                  operator[]((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                              *)&local_90,__k);
        *ppNVar6 = pNVar1;
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != (_Rb_tree_node_base *)local_188._8_8_);
  }
  p_Var8 = (base_to_template->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var8 != (_Rb_tree_node_base *)local_188._8_8_) {
    do {
      pNVar3 = *(N **)(p_Var8 + 1);
      if (*(__index_type *)
           ((long)&(pNVar3->data).
                   super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
                   .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                   super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                   super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                   super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                   super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>
           + 0x20) == '\x03') {
        plVar4 = *(long **)&(pNVar3->data).
                            super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
                            .
                            super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>
                            .
                            super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>
                            .
                            super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>
                            .
                            super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>
                            .
                            super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>
                            ._M_u;
        plVar5 = (long *)*plVar4;
        if (plVar4[1] - (long)plVar5 != 8) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this,"Node creation/deletion in rewriting is not yet implemented");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_108 = (N *)p_Var8[1]._M_parent;
        local_110 = (N *)*plVar5;
        local_118 = 0;
        local_128 = (void *)0x0;
        uStack_120 = 0;
        local_138 = 0;
        local_148 = (void *)0x0;
        uStack_140 = 0;
        _Stack_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        _Stack_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        _Stack_d0._M_impl.super__Rb_tree_header._M_header._M_left =
             &_Stack_d0._M_impl.super__Rb_tree_header._M_header;
        _Stack_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_100._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_100._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_100._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_100._M_impl.super__Rb_tree_header._M_header;
        local_100._M_impl.super__Rb_tree_header._M_node_count = 0;
        ppNVar11 = (pNVar3->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_98 = (pNVar3->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        local_178 = pNVar3;
        local_100._M_impl.super__Rb_tree_header._M_header._M_right =
             local_100._M_impl.super__Rb_tree_header._M_header._M_left;
        _Stack_d0._M_impl.super__Rb_tree_header._M_header._M_right =
             _Stack_d0._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Stack_a0 = p_Var8;
        if (ppNVar11 != local_98) {
          do {
            local_188._0_8_ = *ppNVar11;
            N::operator[](&local_168,local_178,(N *)local_188._0_8_);
            pCVar12 = &local_168;
            do {
              pnVar9 = pCVar12;
              pCVar12 = pnVar9->next;
            } while (pCVar12 !=
                     (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                      *)0x0);
            pNVar3 = (N *)(pnVar9->_end)._M_current;
            _Var10._M_current = local_168._end._M_current;
            pCVar12 = local_168.next;
            _Var13._M_current = local_168._start._M_current;
            while (pCVar12 !=
                   (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                    *)0x0 || (N *)_Var13._M_current != pNVar3) {
              local_170 = (N *)(((N *)_Var13._M_current)->osi).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
              std::vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>>::emplace_back<N*&,N*&>
                        ((vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>> *)&local_128,
                         (N **)local_188,&local_170);
              _Var13._M_current =
                   (N **)&(((N *)_Var13._M_current)->osi).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              if ((pCVar12 !=
                   (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                    *)0x0) && (_Var13._M_current == _Var10._M_current)) {
                _Var10._M_current = (pCVar12->_end)._M_current;
                _Var13._M_current = (pCVar12->_curr)._M_current;
                pCVar12 = pCVar12->next;
              }
            }
            ppNVar11 = ppNVar11 + 1;
          } while (ppNVar11 != local_98);
        }
        ppNVar11 = (local_110->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_178 = (N *)(local_110->ps).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                         super__Vector_impl_data._M_finish;
        if ((N *)ppNVar11 != local_178) {
          do {
            local_188._0_8_ = *ppNVar11;
            N::operator[](&local_168,local_110,(N *)local_188._0_8_);
            pCVar12 = &local_168;
            do {
              pnVar9 = pCVar12;
              pCVar12 = pnVar9->next;
            } while (pCVar12 !=
                     (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                      *)0x0);
            pNVar3 = (N *)(pnVar9->_end)._M_current;
            _Var10._M_current = local_168._end._M_current;
            pCVar12 = local_168.next;
            _Var13._M_current = local_168._start._M_current;
            while (pCVar12 !=
                   (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                    *)0x0 || (N *)_Var13._M_current != pNVar3) {
              local_170 = (N *)(((N *)_Var13._M_current)->osi).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
              std::vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>>::emplace_back<N*&,N*&>
                        ((vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>> *)&local_148,
                         (N **)local_188,&local_170);
              _Var13._M_current =
                   (N **)&(((N *)_Var13._M_current)->osi).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              if ((pCVar12 !=
                   (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                    *)0x0) && (_Var13._M_current == _Var10._M_current)) {
                _Var10._M_current = (pCVar12->_end)._M_current;
                _Var13._M_current = (pCVar12->_curr)._M_current;
                pCVar12 = pCVar12->next;
              }
            }
            ppNVar11 = ppNVar11 + 1;
          } while ((N *)ppNVar11 != local_178);
        }
        std::
        __set_difference<__gnu_cxx::__normal_iterator<std::pair<N*,N*>*,std::vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>>>,__gnu_cxx::__normal_iterator<std::pair<N*,N*>*,std::vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>>>,std::insert_iterator<std::set<std::pair<N*,N*>,std::less<std::pair<N*,N*>>,std::allocator<std::pair<N*,N*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_128,uStack_120,local_148,uStack_140,&_Stack_d0,
                   _Stack_d0._M_impl.super__Rb_tree_header._M_header._M_left);
        std::
        __set_difference<__gnu_cxx::__normal_iterator<std::pair<N*,N*>*,std::vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>>>,__gnu_cxx::__normal_iterator<std::pair<N*,N*>*,std::vector<std::pair<N*,N*>,std::allocator<std::pair<N*,N*>>>>,std::insert_iterator<std::set<std::pair<N*,N*>,std::less<std::pair<N*,N*>>,std::allocator<std::pair<N*,N*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_148,uStack_140,local_128,uStack_120,&local_100,
                   local_100._M_impl.super__Rb_tree_header._M_header._M_left);
        p_Var7 = _Stack_d0._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((_Rb_tree_header *)_Stack_d0._M_impl.super__Rb_tree_header._M_header._M_left !=
            &_Stack_d0._M_impl.super__Rb_tree_header) {
          do {
            pNVar3 = *(N **)(p_Var7 + 1);
            local_168._end._M_current = (N **)p_Var7[1]._M_parent;
            local_168._start._M_current = (N **)pNVar3;
            ppNVar6 = std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                      ::operator[]((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                                    *)&local_90,(key_type *)&local_168._end);
            ppNVar6 = std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                      ::operator[]((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                                    *)&local_60,ppNVar6);
            local_188._0_8_ = *ppNVar6;
            ns._M_len = 1;
            ns._M_array = (iterator)local_188;
            N::disconnect(local_108,pNVar3,ns);
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
          } while ((_Rb_tree_header *)p_Var7 != &_Stack_d0._M_impl.super__Rb_tree_header);
        }
        p_Var7 = local_100._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((_Rb_tree_header *)local_100._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_100._M_impl.super__Rb_tree_header) {
          do {
            pNVar3 = *(N **)(p_Var7 + 1);
            local_168._end._M_current = (N **)p_Var7[1]._M_parent;
            local_168._start._M_current = (N **)pNVar3;
            ppNVar6 = std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                      ::operator[]((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                                    *)&local_90,(key_type *)&local_168._end);
            ppNVar6 = std::map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                      ::operator[]((map<N_*,_N_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
                                    *)&local_60,ppNVar6);
            local_188._0_8_ = *ppNVar6;
            N::connect(local_108,(int)pNVar3,(sockaddr *)local_188,1);
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
          } while ((_Rb_tree_header *)p_Var7 != &local_100._M_impl.super__Rb_tree_header);
        }
        std::
        _Rb_tree<std::pair<N_*,_N_*>,_std::pair<N_*,_N_*>,_std::_Identity<std::pair<N_*,_N_*>_>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
        ::~_Rb_tree(&local_100);
        std::
        _Rb_tree<std::pair<N_*,_N_*>,_std::pair<N_*,_N_*>,_std::_Identity<std::pair<N_*,_N_*>_>,_std::less<std::pair<N_*,_N_*>_>,_std::allocator<std::pair<N_*,_N_*>_>_>
        ::~_Rb_tree(&_Stack_d0);
        if (local_148 != (void *)0x0) {
          operator_delete(local_148,local_138 - (long)local_148);
        }
        p_Var8 = p_Stack_a0;
        if (local_128 != (void *)0x0) {
          operator_delete(local_128,local_118 - (long)local_128);
        }
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != (_Rb_tree_node_base *)local_188._8_8_);
  }
  std::
  _Rb_tree<N_*,_std::pair<N_*const,_N_*>,_std::_Select1st<std::pair<N_*const,_N_*>_>,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<N_*,_std::pair<N_*const,_N_*>,_std::_Select1st<std::pair<N_*const,_N_*>_>,_std::less<N_*>,_std::allocator<std::pair<N_*const,_N_*>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void apply_mapping(NS* base, std::map<N*, N*>& base_to_template) {
    std::map<N*, N*> template_to_base;
    for (auto&& p : base_to_template)
        template_to_base[p.second] = p.first;


    std::map<N*, N*> nested_to_template;
    for (auto [template_n, base_n] : base_to_template) {
        if (NS** g = std::get_if<NS*>(&template_n->data)) {
            if ((*g)->_os.size() == 1){
                nested_to_template[(*g)->_os[0]] = template_n;
            }
        }
    }


    for (auto [template_n, base_n] : base_to_template) {
        if (NS** g = std::get_if<NS*>(&template_n->data)) {
            if ((*g)->_os.size() != 1) throw std::runtime_error("Node creation/deletion in rewriting is not yet implemented");
            N* nested_n = (*g)->_os[0];
            std::vector<std::pair<N*, N*>> template_connections, nested_connections;
            std::set<std::pair<N*, N*>> deleted, added;
            for (N* p : template_n->ps) for (N* o : (*template_n)[p]) template_connections.emplace_back(p, o);
            for (N* p : nested_n->ps) for (N* o : (*nested_n)[p]) nested_connections.emplace_back(p, o);
            std::set_difference(template_connections.begin(), template_connections.end(), nested_connections.begin(), nested_connections.end(), std::inserter(deleted, deleted.begin()));
            std::set_difference(nested_connections.begin(), nested_connections.end(), template_connections.begin(), template_connections.end(), std::inserter(added, added.begin()));
            //for (auto [p, o] : deleted) std::cout << "delete " << *base_n << " |" << *p << "> " << *o << std::endl;
            for (auto [p, o] : deleted) base_n->disconnect(p, {template_to_base[nested_to_template[o]]});
            for (auto [p, o] : added) base_n->connect(p, {template_to_base[nested_to_template[o]]});
        }
    }
}